

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QThemeIconInfo * __thiscall
QIconLoader::findIconHelper
          (QIconLoader *this,QString *themeName,QString *iconName,QStringList *visited,DashRule rule
          )

{
  QStringView name;
  bool bVar1;
  bool bVar2;
  QIconTheme *this_00;
  const_iterator __last;
  qsizetype qVar3;
  anon_class_8_1_89901123_for__M_pred __pred;
  QIconCacheGtkReader *pQVar4;
  char **ppcVar5;
  const_iterator o;
  const_iterator __position;
  ulong uVar6;
  pointer pPVar7;
  pointer pSVar8;
  QDebug *pQVar9;
  QString *in_RCX;
  QIconLoader *in_RDX;
  __off_t __length;
  char *in_RSI;
  QThemeIconInfo *in_RDI;
  QString *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar10;
  QByteArrayView QVar11;
  int indexOfDash;
  int i_1;
  QIconDirInfo *dirInfo;
  int j;
  QList<const_char_*> *__range5;
  int i;
  bool searchingGenericFallback;
  QIconTheme *theme;
  QThemeIconInfo *info;
  QStringList _visited;
  QString parentTheme;
  QStringList parents;
  __single_object iconEntry_1;
  QString svgPath;
  __single_object iconEntry;
  QString pngPath;
  QString subDir;
  QString contentDir;
  const_iterator it;
  QString path;
  char *s;
  const_iterator __end5;
  const_iterator __begin5;
  QList<QIconDirInfo> subDirsCopy;
  QList<const_char_*> result;
  QSharedPointer<QIconCacheGtkReader> cache;
  QList<QIconDirInfo> subDirs;
  QString pngIconName;
  QString svgIconName;
  QStringView iconNameFallback;
  QStringList contentDirs;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffa48;
  CaseSensitivity in_stack_fffffffffffffa4c;
  QIconLoader *in_stack_fffffffffffffa50;
  QListSpecialMethods<QString> *in_stack_fffffffffffffa58;
  const_reference in_stack_fffffffffffffa60;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
  *in_stack_fffffffffffffa68;
  QIconTheme *in_stack_fffffffffffffa70;
  const_iterator __first;
  int local_55c;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  QString *in_stack_fffffffffffffac8;
  QIconTheme *in_stack_fffffffffffffad0;
  QList<const_char_*> *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  int iVar12;
  int local_50c;
  DashRule rule_00;
  uint in_stack_fffffffffffffb00;
  uint uVar13;
  QIconLoader *this_01;
  QDebug local_450;
  QChar local_442 [25];
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  QDebug local_3d8;
  QDebug local_3d0;
  QDebug local_3c8;
  QDebug local_3c0;
  QDebug local_3b8;
  QList<QString> local_3b0 [2];
  undefined1 *local_378;
  QStringBuilder<const_QString_&,_const_QString_&> local_370;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *local_340;
  undefined1 *local_330;
  QStringBuilder<const_QString_&,_const_QString_&> local_328;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined2 local_2fa;
  QStringBuilder<QString_&,_const_QString_&> local_2f8;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  QString *local_2d0;
  char16_t local_2c8;
  undefined2 local_2ba;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  undefined1 *local_2a8;
  const_iterator local_298;
  storage_type *local_290;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char **local_260;
  const_iterator local_258;
  const_iterator local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  storage_type_conflict *local_228;
  QList<const_char_*> local_220;
  undefined1 *local_208;
  undefined1 *local_200;
  QList<QIconDirInfo> local_1f8;
  QLatin1StringView local_1e0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  QLatin1StringView local_1a0;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  QStringView local_160;
  QList<QString> local_150 [2];
  QDebug local_118 [18];
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QString *local_38;
  char16_t local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  __first.i = (QIconDirInfo *)in_RDI;
  lcIconLoader();
  anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffa50,
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x29feac);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
               (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
               (char *)0x29fec5);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffa60,(QString *)in_stack_fffffffffffffa58);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffa60,(QString *)in_stack_fffffffffffffa58);
    pQVar9 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
    QDebug::QDebug(&local_80,pQVar9);
    ::operator<<((QDebug *)in_stack_fffffffffffffa68,(QList<QString> *)in_stack_fffffffffffffa60);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    local_10 = 0;
  }
  in_stack_fffffffffffffb00 = in_stack_fffffffffffffb00 & 0xffffff;
  memset(__first.i,0,0x30);
  (((QThemeIconInfo *)__first.i)->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (((QThemeIconInfo *)__first.i)->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (((QThemeIconInfo *)__first.i)->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  (((QThemeIconInfo *)__first.i)->iconName).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (((QThemeIconInfo *)__first.i)->iconName).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (((QThemeIconInfo *)__first.i)->iconName).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QThemeIconInfo::QThemeIconInfo((QThemeIconInfo *)in_stack_fffffffffffffa50);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_fffffffffffffa50,
             (parameter_type)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  this_00 = QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
            ::operator[]((QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
                          *)in_stack_fffffffffffffa60,(QString *)in_stack_fffffffffffffa58);
  bVar1 = QIconTheme::isValid(this_00);
  if (!bVar1) {
    QIconTheme::QIconTheme(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    QIconTheme::operator=
              ((QIconTheme *)in_stack_fffffffffffffa50,
               (QIconTheme *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    QIconTheme::~QIconTheme((QIconTheme *)in_stack_fffffffffffffa50);
    bVar1 = QIconTheme::isValid(this_00);
    if (!bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcIconLoader();
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffa50,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a0102);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                   (char *)0x2a011b);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffa60,(QString *)in_stack_fffffffffffffa58)
        ;
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
        QDebug::~QDebug(local_118);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      uVar13 = 0x1000000;
      goto LAB_002a114e;
    }
  }
  local_150[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_150[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_150[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QIconTheme::contentDirs
            ((QIconTheme *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  local_160.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_160.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_fffffffffffffa60,(QString *)in_stack_fffffffffffffa58);
  __last.i = (QIconDirInfo *)QString::length((QString *)0x2a021d);
  qVar3 = QString::length((QString *)0x2a022f);
  bVar1 = (long)__last.i <= qVar3;
  bVar2 = std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                   *)in_stack_fffffffffffffa58);
  if (bVar2) {
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_1a0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QStringView *)in_stack_fffffffffffffa50,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringView_&,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1e0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QStringView *)in_stack_fffffffffffffa50,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringView_&,_QLatin1String> *)
               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    iVar12 = 0;
    while( true ) {
      __pred.path = (QString *)(long)iVar12;
      qVar3 = QList<QString>::size(local_150);
      if (qVar3 <= (long)__pred.path) break;
      local_1f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_1f8.d.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
      local_1f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QIconTheme::keyList((QIconTheme *)
                          CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      local_208 = &DAT_aaaaaaaaaaaaaaaa;
      local_200 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QSharedPointer<QIconCacheGtkReader>_>::at
                ((QList<QSharedPointer<QIconCacheGtkReader>_> *)in_stack_fffffffffffffa50,
                 CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      QSharedPointer<QIconCacheGtkReader>::QSharedPointer
                ((QSharedPointer<QIconCacheGtkReader> *)in_stack_fffffffffffffa50,
                 (QSharedPointer<QIconCacheGtkReader> *)
                 CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      pQVar4 = QSharedPointer<QIconCacheGtkReader>::operator->
                         ((QSharedPointer<QIconCacheGtkReader> *)0x2a0425);
      bVar2 = QIconCacheGtkReader::isValid(pQVar4);
      if (bVar2) {
        local_220.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_220.d.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        local_220.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QSharedPointer<QIconCacheGtkReader>::operator->
                  ((QSharedPointer<QIconCacheGtkReader> *)0x2a0470);
        local_230 = (undefined1 *)local_160.m_size;
        local_228 = local_160.m_data;
        name.m_data._0_4_ = in_stack_fffffffffffffae8;
        name.m_size = (qsizetype)in_stack_fffffffffffffae0;
        name.m_data._4_4_ = iVar12;
        QIconCacheGtkReader::lookup
                  ((QIconCacheGtkReader *)
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),name);
        pQVar4 = QSharedPointer<QIconCacheGtkReader>::operator->
                           ((QSharedPointer<QIconCacheGtkReader> *)0x2a04bd);
        bVar2 = QIconCacheGtkReader::isValid(pQVar4);
        if (bVar2) {
          local_248 = &DAT_aaaaaaaaaaaaaaaa;
          local_240 = &DAT_aaaaaaaaaaaaaaaa;
          local_238 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QIconDirInfo>::QList
                    ((QList<QIconDirInfo> *)in_stack_fffffffffffffa50,
                     (QList<QIconDirInfo> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          QList<QIconDirInfo>::clear((QList<QIconDirInfo> *)in_stack_fffffffffffffa50);
          QList<const_char_*>::size(&local_220);
          QList<QIconDirInfo>::reserve
                    ((QList<QIconDirInfo> *)__pred.path,
                     CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
          in_stack_fffffffffffffae0 = &local_220;
          local_250.i = (char **)&DAT_aaaaaaaaaaaaaaaa;
          local_250 = QList<const_char_*>::begin((QList<const_char_*> *)in_stack_fffffffffffffa50);
          local_258.i = (char **)&DAT_aaaaaaaaaaaaaaaa;
          local_258 = QList<const_char_*>::end((QList<const_char_*> *)in_stack_fffffffffffffa50);
          while( true ) {
            local_260 = local_258.i;
            bVar2 = QList<const_char_*>::const_iterator::operator!=(&local_250,local_258);
            if (!bVar2) break;
            ppcVar5 = QList<const_char_*>::const_iterator::operator*(&local_250);
            local_268 = *ppcVar5;
            local_280 = &DAT_aaaaaaaaaaaaaaaa;
            local_278 = &DAT_aaaaaaaaaaaaaaaa;
            local_270 = &DAT_aaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)in_stack_fffffffffffffa60,
                       (char **)in_stack_fffffffffffffa58);
            QVar11.m_data = local_290;
            QVar11.m_size = (qsizetype)&local_280;
            QString::fromUtf8(QVar11);
            local_298.i = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
            QList<QIconDirInfo>::cbegin((QList<QIconDirInfo> *)in_stack_fffffffffffffa50);
            QList<QIconDirInfo>::cend((QList<QIconDirInfo> *)in_stack_fffffffffffffa50);
            local_298 = std::
                        find_if<QList<QIconDirInfo>::const_iterator,QIconLoader::findIconHelper(QString_const&,QString_const&,QList<QString>&,QIconLoader::DashRule)const::__0>
                                  (__first,__last,__pred);
            o = QList<QIconDirInfo>::cend((QList<QIconDirInfo> *)in_stack_fffffffffffffa50);
            bVar2 = QList<QIconDirInfo>::const_iterator::operator!=(&local_298,o);
            if (bVar2) {
              QList<QIconDirInfo>::const_iterator::operator*(&local_298);
              QList<QIconDirInfo>::append
                        ((QList<QIconDirInfo> *)in_stack_fffffffffffffa50,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
            }
            QString::~QString((QString *)0x2a070b);
            QList<const_char_*>::const_iterator::operator++(&local_250);
          }
          QList<QIconDirInfo>::~QList((QList<QIconDirInfo> *)0x2a072a);
        }
        QList<const_char_*>::~QList((QList<const_char_*> *)0x2a0737);
      }
      local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)in_stack_fffffffffffffa50,
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      local_2ba = 0x2f;
      QVar10 = ::operator+((QString *)in_stack_fffffffffffffa58,
                           (char16_t *)in_stack_fffffffffffffa50);
      local_2d0 = QVar10.a;
      local_2c8 = QVar10.b;
      local_38 = local_2d0;
      local_30 = local_2c8;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QString_&,_char16_t> *)
                 CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      in_stack_fffffffffffffabc = 0;
      while( true ) {
        in_stack_fffffffffffffa70 = (QIconTheme *)(long)in_stack_fffffffffffffabc;
        qVar3 = QList<QIconDirInfo>::size(&local_1f8);
        if (qVar3 <= (long)in_stack_fffffffffffffa70) break;
        __position._M_current =
             (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *)
             QList<QIconDirInfo>::at
                       ((QList<QIconDirInfo> *)in_stack_fffffffffffffa50,
                        CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        if ((bVar1) ||
           ((((const_reference)__position._M_current)->context != Applications &&
            (((const_reference)__position._M_current)->context != MimeTypes)))) {
          local_2e8 = &DAT_aaaaaaaaaaaaaaaa;
          local_2e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_2f8 = ::operator+((QString *)in_stack_fffffffffffffa50,
                                  (QString *)
                                  CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          local_2fa = 0x2f;
          ::operator+((QStringBuilder<QString_&,_const_QString_&> *)in_stack_fffffffffffffa50,
                      (char16_t *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          local_318 = &DAT_aaaaaaaaaaaaaaaa;
          local_310 = &DAT_aaaaaaaaaaaaaaaa;
          local_308 = &DAT_aaaaaaaaaaaaaaaa;
          local_328 = ::operator+((QString *)in_stack_fffffffffffffa50,
                                  (QString *)
                                  CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<const_QString_&,_const_QString_&> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          uVar6 = QFile::exists((QString *)&local_318);
          if ((uVar6 & 1) == 0) {
            if ((in_RSI[0x18] & 1U) != 0) {
              local_360 = &DAT_aaaaaaaaaaaaaaaa;
              local_358 = &DAT_aaaaaaaaaaaaaaaa;
              local_350 = &DAT_aaaaaaaaaaaaaaaa;
              local_370 = ::operator+((QString *)in_stack_fffffffffffffa50,
                                      (QString *)
                                      CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<const_QString_&,_const_QString_&> *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
              uVar6 = QFile::exists((QString *)&local_360);
              if ((uVar6 & 1) != 0) {
                local_378 = &DAT_aaaaaaaaaaaaaaaa;
                std::make_unique<ScalableEntry>();
                std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::operator->
                          ((unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)
                           0x2a0af3);
                QIconDirInfo::operator=
                          ((QIconDirInfo *)in_stack_fffffffffffffa50,
                           (QIconDirInfo *)
                           CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
                pSVar8 = std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::
                         operator->((unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>
                                     *)0x2a0b11);
                QString::operator=(&(pSVar8->super_QIconLoaderEngineEntry).filename,
                                   (QString *)&local_360);
                std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>
                ::unique_ptr<ScalableEntry,std::default_delete<ScalableEntry>,void>
                          (__position._M_current,
                           (unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)
                           in_stack_fffffffffffffa58);
                std::
                vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                ::push_back((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                             *)in_stack_fffffffffffffa50,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
                std::
                unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
                ~unique_ptr((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                             *)in_stack_fffffffffffffa50);
                std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::~unique_ptr
                          ((unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_> *)
                           in_stack_fffffffffffffa50);
                in_stack_fffffffffffffa60 = (const_reference)__position._M_current;
              }
              QString::~QString((QString *)0x2a0b73);
            }
          }
          else {
            local_330 = &DAT_aaaaaaaaaaaaaaaa;
            std::make_unique<PixmapEntry>();
            std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::operator->
                      ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)0x2a0988);
            QIconDirInfo::operator=
                      ((QIconDirInfo *)in_stack_fffffffffffffa50,
                       (QIconDirInfo *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)
                      );
            pPVar7 = std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::operator->
                               ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)
                                0x2a09a6);
            QString::operator=(&(pPVar7->super_QIconLoaderEngineEntry).filename,
                               (QString *)&local_318);
            local_340 = (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                         *)std::
                           vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                           ::begin((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                                    *)in_stack_fffffffffffffa50);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>const*,std::vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>>
            ::
            __normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>*>
                      ((__normal_iterator<const_std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
                        *)in_stack_fffffffffffffa50,
                       (__normal_iterator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_*,_std::vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
            std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>::
            unique_ptr<PixmapEntry,std::default_delete<PixmapEntry>,void>
                      ((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                        *)in_stack_fffffffffffffa60,
                       (unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)
                       in_stack_fffffffffffffa58);
            std::
            vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ::insert((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                      *)in_stack_fffffffffffffa50,__position,
                     (value_type *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
            std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>::
            ~unique_ptr((unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                         *)in_stack_fffffffffffffa50);
            std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                      ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)
                       in_stack_fffffffffffffa50);
            in_stack_fffffffffffffa68 = __position._M_current;
          }
          QString::~QString((QString *)0x2a0b82);
          QString::~QString((QString *)0x2a0b8f);
        }
        in_stack_fffffffffffffabc = in_stack_fffffffffffffabc + 1;
      }
      QString::~QString((QString *)0x2a0bac);
      QSharedPointer<QIconCacheGtkReader>::~QSharedPointer
                ((QSharedPointer<QIconCacheGtkReader> *)0x2a0bb9);
      QList<QIconDirInfo>::~QList((QList<QIconDirInfo> *)0x2a0bc6);
      iVar12 = iVar12 + 1;
    }
    bVar1 = std::
            vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                     *)in_stack_fffffffffffffa58);
    if (!bVar1) {
      QStringView::toString((QStringView *)in_stack_fffffffffffffa50);
      QString::operator=((QString *)in_stack_fffffffffffffa50,
                         (QString *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      QString::~QString((QString *)0x2a0c22);
    }
    QString::~QString((QString *)0x2a0c2f);
    QString::~QString((QString *)0x2a0c3c);
  }
  bVar1 = std::
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                   *)in_stack_fffffffffffffa58);
  if (bVar1) {
    local_3b0[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_3b0[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_3b0[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QIconTheme::parents(in_stack_fffffffffffffa70);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffa50,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_60), bVar1) {
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a0ce7);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                 (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (char *)0x2a0d00);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
      pQVar9 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
      QDebug::QDebug(&local_3d0,pQVar9);
      ::operator<<((QDebug *)in_stack_fffffffffffffa68,(QList<QString> *)in_stack_fffffffffffffa60);
      pQVar9 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
      QDebug::QDebug(&local_3c0,pQVar9);
      ::operator<<((QDebug *)in_stack_fffffffffffffa68,(QList<QString> *)in_stack_fffffffffffffa60);
      QDebug::~QDebug(&local_3b8);
      QDebug::~QDebug(&local_3c0);
      QDebug::~QDebug(&local_3c8);
      QDebug::~QDebug(&local_3d0);
      QDebug::~QDebug(&local_3d8);
      local_58 = (undefined1 *)((ulong)local_58 & 0xffffffffffffff00);
    }
    local_55c = 0;
    while( true ) {
      in_stack_fffffffffffffa58 = (QListSpecialMethods<QString> *)(long)local_55c;
      qVar3 = QList<QString>::size(local_3b0);
      if (qVar3 <= (long)in_stack_fffffffffffffa58) break;
      local_410 = &DAT_aaaaaaaaaaaaaaaa;
      local_408 = &DAT_aaaaaaaaaaaaaaaa;
      local_400 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)in_stack_fffffffffffffa50,
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      QString::trimmed((QString *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      bVar1 = QListSpecialMethods<QString>::contains
                        (in_stack_fffffffffffffa58,(QString *)in_stack_fffffffffffffa50,
                         in_stack_fffffffffffffa4c);
      if (!bVar1) {
        findIconHelper(in_RDX,in_RCX,in_R8,(QStringList *)CONCAT44(in_R9D,in_stack_fffffffffffffb00)
                       ,(DashRule)((ulong)this_00 >> 0x20));
        QThemeIconInfo::operator=
                  ((QThemeIconInfo *)in_stack_fffffffffffffa50,
                   (QThemeIconInfo *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        QThemeIconInfo::~QThemeIconInfo((QThemeIconInfo *)in_stack_fffffffffffffa50);
      }
      bVar1 = std::
              vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
              ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                       *)in_stack_fffffffffffffa58);
      if (bVar1) {
        local_50c = 0;
      }
      else {
        local_50c = 0x13;
      }
      QString::~QString((QString *)0x2a0f13);
      if (local_50c != 0) break;
      local_55c = local_55c + 1;
    }
    QList<QString>::~QList((QList<QString> *)0x2a0f41);
  }
  if ((in_R9D == 0) &&
     (bVar1 = std::
              vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
              ::empty((vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                       *)in_stack_fffffffffffffa58), bVar1)) {
    QChar::QChar<char16_t,_true>(local_442,L'-');
    qVar3 = QStringView::lastIndexOf
                      ((QStringView *)in_stack_fffffffffffffa50,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffa58 >> 0x30),
                       in_stack_fffffffffffffa4c);
    if ((int)qVar3 != -1) {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      lcIconLoader();
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffa50,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_70);
        rule_00 = (DashRule)((ulong)this_00 >> 0x20);
        if (!bVar1) break;
        anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a0ff0);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                   (char *)0x2a1009);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffa68,in_RSI);
        QDebug::~QDebug(&local_450);
        local_68 = (undefined1 *)((ulong)local_68 & 0xffffffffffffff00);
      }
      QStringView::truncate(&local_160,(char *)(long)(int)qVar3,__length);
      in_stack_fffffffffffffa50 = in_RDX;
      QList<QString>::QList((QList<QString> *)0x2a10a7);
      this_01 = in_stack_fffffffffffffa50;
      QStringView::toString((QStringView *)in_stack_fffffffffffffa50);
      findIconHelper(this_01,in_RCX,in_R8,(QStringList *)CONCAT44(in_R9D,in_stack_fffffffffffffb00),
                     rule_00);
      QThemeIconInfo::operator=
                ((QThemeIconInfo *)in_stack_fffffffffffffa50,
                 (QThemeIconInfo *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      QThemeIconInfo::~QThemeIconInfo((QThemeIconInfo *)in_stack_fffffffffffffa50);
      QString::~QString((QString *)0x2a111f);
      QList<QString>::~QList((QList<QString> *)0x2a112c);
    }
  }
  uVar13 = 0x1000000;
  QList<QString>::~QList((QList<QString> *)0x2a114e);
LAB_002a114e:
  if ((uVar13 & 0x1000000) == 0) {
    QThemeIconInfo::~QThemeIconInfo((QThemeIconInfo *)in_stack_fffffffffffffa50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QThemeIconInfo QIconLoader::findIconHelper(const QString &themeName,
                                           const QString &iconName,
                                           QStringList &visited,
                                           DashRule rule) const
{
    qCDebug(lcIconLoader) << "Finding icon" << iconName << "in theme" << themeName
                          << "skipping" << visited;

    QThemeIconInfo info;
    Q_ASSERT(!themeName.isEmpty());

    // Used to protect against potential recursions
    visited << themeName;

    QIconTheme &theme = themeList[themeName];
    if (!theme.isValid()) {
        theme = QIconTheme(themeName);
        if (!theme.isValid()) {
            qCDebug(lcIconLoader) << "Theme" << themeName << "not found";
            return info;
        }
    }

    const QStringList contentDirs = theme.contentDirs();

    QStringView iconNameFallback(iconName);
    bool searchingGenericFallback = m_iconName.length() > iconName.length();

    // Iterate through all icon's fallbacks in current theme
    if (info.entries.empty()) {
        const QString svgIconName = iconNameFallback + ".svg"_L1;
        const QString pngIconName = iconNameFallback + ".png"_L1;

        // Add all relevant files
        for (int i = 0; i < contentDirs.size(); ++i) {
            QList<QIconDirInfo> subDirs = theme.keyList();

            // Try to reduce the amount of subDirs by looking in the GTK+ cache in order to save
            // a massive amount of file stat (especially if the icon is not there)
            auto cache = theme.m_gtkCaches.at(i);
            if (cache->isValid()) {
                const auto result = cache->lookup(iconNameFallback);
                if (cache->isValid()) {
                    const QList<QIconDirInfo> subDirsCopy = subDirs;
                    subDirs.clear();
                    subDirs.reserve(result.size());
                    for (const char *s : result) {
                        QString path = QString::fromUtf8(s);
                        auto it = std::find_if(subDirsCopy.cbegin(), subDirsCopy.cend(),
                                               [&](const QIconDirInfo &info) {
                                                   return info.path == path; } );
                        if (it != subDirsCopy.cend()) {
                            subDirs.append(*it);
                        }
                    }
                }
            }

            QString contentDir = contentDirs.at(i) + u'/';
            for (int j = 0; j < subDirs.size() ; ++j) {
                const QIconDirInfo &dirInfo = subDirs.at(j);
                if (searchingGenericFallback &&
                        (dirInfo.context == QIconDirInfo::Applications ||
                         dirInfo.context == QIconDirInfo::MimeTypes))
                    continue;

                const QString subDir = contentDir + dirInfo.path + u'/';
                const QString pngPath = subDir + pngIconName;
                if (QFile::exists(pngPath)) {
                    auto iconEntry = std::make_unique<PixmapEntry>();
                    iconEntry->dir = dirInfo;
                    iconEntry->filename = pngPath;
                    // Notice we ensure that pixmap entries always come before
                    // scalable to preserve search order afterwards
                    info.entries.insert(info.entries.begin(), std::move(iconEntry));
                } else if (m_supportsSvg) {
                    const QString svgPath = subDir + svgIconName;
                    if (QFile::exists(svgPath)) {
                        auto iconEntry = std::make_unique<ScalableEntry>();
                        iconEntry->dir = dirInfo;
                        iconEntry->filename = svgPath;
                        info.entries.push_back(std::move(iconEntry));
                    }
                }
            }
        }

        if (!info.entries.empty()) {
            info.iconName = iconNameFallback.toString();
        }
    }

    if (info.entries.empty()) {
        const QStringList parents = theme.parents();
        qCDebug(lcIconLoader) << "Did not find matching icons in theme;"
            << "trying parent themes" << parents
            << "skipping visited" << visited;

        // Search recursively through inherited themes
        for (int i = 0 ; i < parents.size() ; ++i) {

            const QString parentTheme = parents.at(i).trimmed();

            if (!visited.contains(parentTheme)) // guard against recursion
                info = findIconHelper(parentTheme, iconName, visited, QIconLoader::NoFallBack);

            if (!info.entries.empty()) // success
                break;
        }
    }

    if (rule == QIconLoader::FallBack && info.entries.empty()) {
        // If it's possible - find next fallback for the icon
        const int indexOfDash = iconNameFallback.lastIndexOf(u'-');
        if (indexOfDash != -1) {
            qCDebug(lcIconLoader) << "Did not find matching icons in all themes;"
                                  << "trying dash fallback";
            iconNameFallback.truncate(indexOfDash);
            QStringList _visited;
            info = findIconHelper(themeName, iconNameFallback.toString(), _visited, QIconLoader::FallBack);
        }
    }

    return info;
}